

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O1

void DrawStatus(player_t *CPlayer,int x,int y)

{
  char *pcVar1;
  int *piVar2;
  char tempstr [50];
  int local_5c;
  char local_58 [56];
  
  local_5c = x;
  if (hud_showscore.Value) {
    pcVar1 = (char *)(ulong)(uint)(CPlayer->mo->super_AActor).Score;
    mysnprintf(local_58,0x32,"%i ");
    DrawStatLine((int)&local_5c,(int *)"Sc:",local_58,pcVar1);
  }
  if (hud_showstats.Value == true) {
    pcVar1 = (char *)(ulong)(uint)(CPlayer->mo->super_AActor).accuracy;
    mysnprintf(local_58,0x32,"%i ");
    DrawStatLine((int)&local_5c,(int *)"Ac:",local_58,pcVar1);
    pcVar1 = (char *)(ulong)(uint)(CPlayer->mo->super_AActor).stamina;
    mysnprintf(local_58,0x32,"%i ");
    DrawStatLine((int)&local_5c,(int *)"St:",local_58,pcVar1);
  }
  if (deathmatch.Value == 0) {
    if (hud_showsecrets.Value == true) {
      piVar2 = &level.found_secrets;
      if (multiplayer != false) {
        piVar2 = &CPlayer->secretcount;
      }
      pcVar1 = (char *)(ulong)(uint)*piVar2;
      mysnprintf(local_58,0x32,"%i/%i ",pcVar1,(ulong)(uint)level.total_secrets);
      DrawStatLine((int)&local_5c,(int *)"S:",local_58,pcVar1);
    }
    if (hud_showitems.Value == true) {
      piVar2 = &level.found_items;
      if (multiplayer != false) {
        piVar2 = &CPlayer->itemcount;
      }
      pcVar1 = (char *)(ulong)(uint)*piVar2;
      mysnprintf(local_58,0x32,"%i/%i ",pcVar1,(ulong)(uint)level.total_items);
      DrawStatLine((int)&local_5c,(int *)"I:",local_58,pcVar1);
    }
    if (hud_showmonsters.Value == true) {
      piVar2 = &level.killed_monsters;
      if (multiplayer != false) {
        piVar2 = &CPlayer->killcount;
      }
      pcVar1 = (char *)(ulong)(uint)*piVar2;
      mysnprintf(local_58,0x32,"%i/%i ",pcVar1,(ulong)(uint)level.total_monsters);
      DrawStatLine((int)&local_5c,(int *)"K:",local_58,pcVar1);
    }
  }
  return;
}

Assistant:

static void DrawStatus(player_t * CPlayer, int x, int y)
{
	char tempstr[50];
	
	if (hud_showscore)
	{
		mysnprintf(tempstr, countof(tempstr), "%i ", CPlayer->mo->Score);
		DrawStatLine(x, y, "Sc:", tempstr);
	}
	
	if (hud_showstats)
	{
		mysnprintf(tempstr, countof(tempstr), "%i ", CPlayer->mo->accuracy);
		DrawStatLine(x, y, "Ac:", tempstr);
		mysnprintf(tempstr, countof(tempstr), "%i ", CPlayer->mo->stamina);
		DrawStatLine(x, y, "St:", tempstr);
	}
	
	if (!deathmatch)
	{
		// FIXME: ZDoom doesn't preserve the player's stat counters across hubs so this doesn't
		// work in cooperative hub games
		if (hud_showsecrets)
		{
			mysnprintf(tempstr, countof(tempstr), "%i/%i ", multiplayer? CPlayer->secretcount : level.found_secrets, level.total_secrets);
			DrawStatLine(x, y, "S:", tempstr);
		}
		
		if (hud_showitems)
		{
			mysnprintf(tempstr, countof(tempstr), "%i/%i ", multiplayer? CPlayer->itemcount : level.found_items, level.total_items);
			DrawStatLine(x, y, "I:", tempstr);
		}
		
		if (hud_showmonsters)
		{
			mysnprintf(tempstr, countof(tempstr), "%i/%i ", multiplayer? CPlayer->killcount : level.killed_monsters, level.total_monsters);
			DrawStatLine(x, y, "K:", tempstr);
		}
	}
}